

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void * ym2612_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  YM2612 *F2612;
  FM_IRQHANDLER IRQHandler_local;
  FM_TIMERHANDLER timer_handler_local;
  UINT32 rate_local;
  UINT32 clock_local;
  void *param_local;
  
  param_local = calloc(1,0x5120);
  if (param_local == (void *)0x0) {
    param_local = (void *)0x0;
  }
  else {
    init_tables();
    *(void **)((long)param_local + 0x210) = param;
    *(undefined1 *)((long)param_local + 0x208) = 0xe;
    *(long *)((long)param_local + 0x6a0) = (long)param_local + 0x4778;
    *(UINT32 *)((long)param_local + 0x218) = clock;
    *(UINT32 *)((long)param_local + 0x21c) = rate;
    OPNCheckNativeSampleRate((FM_OPN *)((long)param_local + 0x208));
    *(FM_TIMERHANDLER *)((long)param_local + 0x648) = timer_handler;
    *(FM_IRQHANDLER *)((long)param_local + 0x650) = IRQHandler;
    *(undefined1 *)((long)param_local + 0x20a) = 0;
    *(undefined1 *)((long)param_local + 0x5111) = 0;
    OPNLinkSSG((FM_OPN *)((long)param_local + 0x208),(ssg_callbacks *)0x0,(void *)0x0);
    OPNSetSmplRateChgCallback
              ((FM_OPN *)((long)param_local + 0x208),(DEVCB_SRATE_CHG)0x0,(void *)0x0);
    ym2612_set_mute_mask(param_local,0);
  }
  return param_local;
}

Assistant:

void * ym2612_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2612 *F2612;

	/* allocate extend state space */
	F2612 = (YM2612 *)calloc(1, sizeof(YM2612));
	if (F2612 == NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	/* FM */
	F2612->OPN.ST.param = param;
	F2612->OPN.type = TYPE_YM2612;
	F2612->OPN.P_CH = F2612->CH;
	F2612->OPN.ST.clock = clock;
	F2612->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2612->OPN);
	/* Extend handler */
	F2612->OPN.ST.timer_handler = timer_handler;
	F2612->OPN.ST.IRQ_Handler   = IRQHandler;
	F2612->OPN.LegacyMode = 0x00;
	F2612->WaveOutMode = 0x00;
	OPNLinkSSG(&F2612->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2612->OPN, NULL, NULL);

	ym2612_set_mute_mask(F2612, 0x00);

	return F2612;
}